

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O2

LanguageBreakEngine * __thiscall
icu_63::ICULanguageBreakFactory::getEngineFor(ICULanguageBreakFactory *this,UChar32 c)

{
  int iVar1;
  LanguageBreakEngine *obj;
  UStack *this_00;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  size_t size;
  int32_t index;
  UErrorCode status;
  Mutex m;
  
  size = CONCAT44(in_register_00000034,c);
  status = U_ZERO_ERROR;
  m.fMutex = (UMutex *)gBreakEngineMutex;
  umtx_lock_63((UMutex *)gBreakEngineMutex);
  if (this->fEngines == (UStack *)0x0) {
    this_00 = (UStack *)UMemory::operator_new((UMemory *)0x28,size);
    if (this_00 != (UStack *)0x0) {
      UStack::UStack(this_00,_deleteEngine,(UElementsAreEqual *)0x0,&status);
      if (status < U_ILLEGAL_ARGUMENT_ERROR) {
        this->fEngines = this_00;
LAB_002ce49f:
        iVar1 = (*(this->super_LanguageBreakFactory)._vptr_LanguageBreakFactory[3])(this,c);
        obj = (LanguageBreakEngine *)CONCAT44(extraout_var,iVar1);
        if (obj != (LanguageBreakEngine *)0x0) {
          UVector::addElement(&this->fEngines->super_UVector,obj,&status);
          goto LAB_002ce4c8;
        }
      }
      else {
        (*(this_00->super_UVector).super_UObject._vptr_UObject[1])(this_00);
      }
    }
    obj = (LanguageBreakEngine *)0x0;
  }
  else {
    index = (this->fEngines->super_UVector).count;
    do {
      if (index < 1) goto LAB_002ce49f;
      index = index + -1;
      obj = (LanguageBreakEngine *)UVector::elementAt(&this->fEngines->super_UVector,index);
    } while ((obj == (LanguageBreakEngine *)0x0) ||
            (iVar1 = (*obj->_vptr_LanguageBreakEngine[2])(obj,c), (char)iVar1 == '\0'));
  }
LAB_002ce4c8:
  Mutex::~Mutex(&m);
  return obj;
}

Assistant:

const LanguageBreakEngine *
ICULanguageBreakFactory::getEngineFor(UChar32 c) {
    const LanguageBreakEngine *lbe = NULL;
    UErrorCode  status = U_ZERO_ERROR;

    Mutex m(&gBreakEngineMutex);

    if (fEngines == NULL) {
        UStack  *engines = new UStack(_deleteEngine, NULL, status);
        if (U_FAILURE(status) || engines == NULL) {
            // Note: no way to return error code to caller.
            delete engines;
            return NULL;
        }
        fEngines = engines;
    } else {
        int32_t i = fEngines->size();
        while (--i >= 0) {
            lbe = (const LanguageBreakEngine *)(fEngines->elementAt(i));
            if (lbe != NULL && lbe->handles(c)) {
                return lbe;
            }
        }
    }
    
    // We didn't find an engine. Create one.
    lbe = loadEngineFor(c);
    if (lbe != NULL) {
        fEngines->push((void *)lbe, status);
    }
    return lbe;
}